

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedStringView::GenerateByteSize
          (RepeatedStringView *this,Printer *p)

{
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  RepeatedStringView *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "\n      total_size +=\n          $kTagBytes$ * $pbi$::FromIntSize(this_._internal_$name$().size());\n      for (int i = 0, n = this_._internal_$name$().size(); i < n; ++i) {\n        total_size += $pbi$::WireFormatLite::$DeclaredType$Size(\n            this_._internal_$name$().Get(i));\n      }\n    "
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit(p,local_28._M_len,local_28._M_str);
  return;
}

Assistant:

void GenerateByteSize(io::Printer* p) const override {
    p->Emit(R"cc(
      total_size +=
          $kTagBytes$ * $pbi$::FromIntSize(this_._internal_$name$().size());
      for (int i = 0, n = this_._internal_$name$().size(); i < n; ++i) {
        total_size += $pbi$::WireFormatLite::$DeclaredType$Size(
            this_._internal_$name$().Get(i));
      }
    )cc");
  }